

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeGapGrayCode.cpp
# Opt level: O2

map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> * __thiscall
LargeGapGrayCode::computeRunLengths
          (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
           *__return_storage_ptr__,LargeGapGrayCode *this,int bitWidth)

{
  _Rb_tree_header *p_Var1;
  iterator iVar2;
  int iVar3;
  ulong uVar4;
  int runThrough;
  int iVar5;
  int i;
  ulong uVar6;
  undefined1 local_70 [8];
  vector<int,_std::allocator<int>_> transitionLastSeen;
  vector<int,_std::allocator<int>_> t;
  uint local_34 [2];
  int runLength;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &transitionLastSeen.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (this->m_transitionSequences).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + ((long)bitWidth - 1));
  t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)CONCAT44(t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage._4_4_,0xffffffff);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_70,(long)bitWidth,
             (value_type_conflict1 *)
             &t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(allocator_type *)local_34);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  for (iVar5 = 1; iVar5 != 3; iVar5 = iVar5 + 1) {
    uVar6 = 0;
    while( true ) {
      uVar4 = (long)t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start -
              (long)transitionLastSeen.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage >> 2;
      if (uVar4 <= uVar6) break;
      if (*(int *)((long)local_70 +
                  (long)transitionLastSeen.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage[uVar6] * 4) == -1) {
        *(int *)((long)local_70 +
                (long)transitionLastSeen.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage[uVar6] * 4) = (int)uVar6;
      }
      else {
        iVar3 = (int)uVar4 * iVar5 + (int)uVar6;
        local_34[0] = iVar3 - *(int *)((long)local_70 +
                                      (long)transitionLastSeen.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_end_of_storage[uVar6] * 4);
        *(int *)((long)local_70 +
                (long)transitionLastSeen.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage[uVar6] * 4) = iVar3;
        if (iVar5 == 2) {
          iVar2 = std::
                  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                  ::find(&__return_storage_ptr__->_M_t,(key_type *)local_34);
          if ((_Rb_tree_header *)iVar2._M_node == p_Var1) {
            t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)((ulong)local_34[0] | 0x100000000);
            std::
            _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
            ::_M_emplace_unique<std::pair<int,int>>
                      ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                        *)__return_storage_ptr__,
                       (pair<int,_int> *)
                       &t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
          }
          else {
            *(int *)&iVar2._M_node[1].field_0x4 = *(int *)&iVar2._M_node[1].field_0x4 + 1;
          }
        }
      }
      uVar6 = uVar6 + 1;
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_70);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)
             &transitionLastSeen.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

std::map<int, int> LargeGapGrayCode::computeRunLengths(int bitWidth)
{
	std::vector<int> t = m_transitionSequences[bitWidth-1];
	std::vector<int> transitionLastSeen(bitWidth, -1);

	std::map<int, int> numRunLengths;

	for(int runThrough = 1; runThrough <= 2; ++runThrough) {
		for(int i = 0; i < t.size(); ++i) {
			if(transitionLastSeen[t[i]] == -1) {
				transitionLastSeen[t[i]] = i;
			}
			else {
				int runLength = runThrough*t.size()+i-transitionLastSeen[t[i]];
				transitionLastSeen[t[i]] = runThrough*t.size()+i;

				if(runThrough == 2) {
					std::map<int, int>::iterator it = numRunLengths.find(runLength);
					if (it != numRunLengths.end()) {
					    it->second += 1;
					}
					else {
						numRunLengths.insert(std::make_pair(runLength, 1));
					}
				}
			}
		}
	}

	return numRunLengths;
}